

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int enter_close(quicly_conn_t *conn,int param_2,int wait_draining)

{
  byte *pbVar1;
  quicly_sentmap_t *map;
  size_t *psVar2;
  uint64_t *puVar3;
  size_t sVar4;
  quicly_sent_t *pqVar5;
  int iVar6;
  st_quicly_sent_block_t *psVar7;
  long lVar8;
  uint32_t uVar9;
  
  if (QUICLY_STATE_CONNECTED < (conn->super).state) {
    __assert_fail("conn->super.state < QUICLY_STATE_CLOSING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                  ,0x11d2,"int enter_close(quicly_conn_t *, int, int)");
  }
  iVar6 = discard_sentmap_by_epoch(conn,0xffffffff);
  if (iVar6 != 0) {
    return iVar6;
  }
  map = &(conn->egress).loss.sentmap;
  iVar6 = quicly_sentmap_prepare(map,(conn->egress).packet_number,(conn->stash).now,'\0');
  if (iVar6 != 0) {
    return iVar6;
  }
  psVar7 = (conn->egress).loss.sentmap.tail;
  if (((psVar7 == (st_quicly_sent_block_t *)0x0) || (psVar7->next_insert_at == 0x10)) &&
     (psVar7 = quicly_sentmap__new_block(map), psVar7 == (st_quicly_sent_block_t *)0x0)) {
    return 0x201;
  }
  sVar4 = psVar7->next_insert_at;
  psVar7->num_entries = psVar7->num_entries + 1;
  psVar7->next_insert_at = psVar7->next_insert_at + 1;
  psVar7->entries[sVar4].acked = on_end_closing;
  pqVar5 = (conn->egress).loss.sentmap._pending_packet;
  if (pqVar5 == (quicly_sent_t *)0x0) {
    __assert_fail("quicly_sentmap_is_open(map)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                  ,0x10c,"void quicly_sentmap_commit(quicly_sentmap_t *, uint16_t)");
  }
  pbVar1 = (byte *)((long)&pqVar5->data + 0x11);
  *pbVar1 = *pbVar1 | 2;
  (conn->egress).loss.sentmap._pending_packet = (quicly_sent_t *)0x0;
  psVar2 = &(conn->egress).loss.sentmap.num_packets;
  *psVar2 = *psVar2 + 1;
  puVar3 = &(conn->egress).packet_number;
  *puVar3 = *puVar3 + 1;
  if (param_2 == 0) {
    (conn->super).state = QUICLY_STATE_DRAINING;
    if (wait_draining != 0) {
      uVar9 = (conn->egress).loss.rtt.variance;
      if (uVar9 == 0) {
        uVar9 = ((conn->egress).loss.conf)->min_pto;
      }
      else {
        uVar9 = uVar9 << 2;
      }
      lVar8 = (ulong)(((uint)(conn->super).remote.transport_params.max_ack_delay +
                       (conn->egress).loss.rtt.smoothed + uVar9) * 4) + (conn->stash).now;
      goto LAB_0013232f;
    }
  }
  else {
    (conn->super).state = QUICLY_STATE_CLOSING;
  }
  lVar8 = 0;
LAB_0013232f:
  (conn->egress).send_ack_at = lVar8;
  update_loss_alarm(conn,0);
  return 0;
}

Assistant:

static int enter_close(quicly_conn_t *conn, int local_is_initiating, int wait_draining)
{
    int ret;

    assert(conn->super.state < QUICLY_STATE_CLOSING);

    /* release all inflight info, register a close timeout */
    if ((ret = discard_sentmap_by_epoch(conn, ~0u)) != 0)
        return ret;
    if ((ret = quicly_sentmap_prepare(&conn->egress.loss.sentmap, conn->egress.packet_number, conn->stash.now,
                                      QUICLY_EPOCH_INITIAL)) != 0)
        return ret;
    if (quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_end_closing) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    quicly_sentmap_commit(&conn->egress.loss.sentmap, 0);
    ++conn->egress.packet_number;

    if (local_is_initiating) {
        conn->super.state = QUICLY_STATE_CLOSING;
        conn->egress.send_ack_at = 0;
    } else {
        conn->super.state = QUICLY_STATE_DRAINING;
        conn->egress.send_ack_at = wait_draining ? conn->stash.now + get_sentmap_expiration_time(conn) : 0;
    }

    update_loss_alarm(conn, 0);

    return 0;
}